

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getsockname.c
# Opt level: O0

void udp_recv(uv_udp_t *handle,ssize_t nread,uv_buf_t *buf,sockaddr *addr,uint flags)

{
  int iVar1;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  undefined4 local_48;
  int r;
  int namelen;
  sockaddr sockname;
  uint flags_local;
  sockaddr *addr_local;
  uv_buf_t *buf_local;
  ssize_t nread_local;
  uv_udp_t *handle_local;
  
  sockname.sa_data._6_4_ = flags;
  unique0x100001c8 = addr;
  if (nread < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-getsockname.c"
            ,0xf8,"nread",">=","0",nread,">=",0);
    abort();
  }
  free(buf->base);
  if (nread != 0) {
    memset(&r,0xff,0x10);
    local_48 = 0x10;
    iVar1 = uv_udp_getsockname(&udp,&r,&local_48);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-getsockname.c"
              ,0x102,"r","==","0",(long)iVar1,"==",0);
      abort();
    }
    check_sockname((sockaddr *)&r,"0.0.0.0",0,"udp receiving socket");
    getsocknamecount_udp = getsocknamecount_udp + 1;
    uv_close(&udp,0);
    uv_close(handle,0);
  }
  return;
}

Assistant:

static void udp_recv(uv_udp_t* handle,
                     ssize_t nread,
                     const uv_buf_t* buf,
                     const struct sockaddr* addr,
                     unsigned flags) {
  struct sockaddr sockname;
  int namelen;
  int r;

  ASSERT_GE(nread, 0);
  free(buf->base);

  if (nread == 0) {
    return;
  }

  memset(&sockname, -1, sizeof sockname);
  namelen = sizeof(sockname);
  r = uv_udp_getsockname(&udp, &sockname, &namelen);
  ASSERT_OK(r);
  check_sockname(&sockname, "0.0.0.0", 0, "udp receiving socket");
  getsocknamecount_udp++;

  uv_close((uv_handle_t*) &udp, NULL);
  uv_close((uv_handle_t*) handle, NULL);
}